

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O2

void Aig_ManPartSplitOne_rec(Aig_Man_t *pNew,Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Int_t *vPio2Id)

{
  ulong uVar1;
  Aig_Obj_t *p1;
  Aig_Obj_t *pAVar2;
  ulong uStack_30;
  
  if (pObj->TravId == p->nTravIds) {
    if ((pObj->field_5).pData == (void *)0x0) {
      Aig_ManPartSplitOne_rec
                (pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vPio2Id);
      Aig_ManPartSplitOne_rec
                (pNew,p,(Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vPio2Id);
      if (((ulong)pObj & 1) != 0) {
        __assert_fail("!Aig_IsComplement(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                      ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
      }
      uVar1 = (ulong)pObj->pFanin0 & 0xfffffffffffffffe;
      if (uVar1 == 0) {
        pAVar2 = (Aig_Obj_t *)0x0;
      }
      else {
        pAVar2 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin0 & 1) ^ *(ulong *)(uVar1 + 0x28));
      }
      uVar1 = (ulong)pObj->pFanin1 & 0xfffffffffffffffe;
      if (uVar1 == 0) {
        p1 = (Aig_Obj_t *)0x0;
      }
      else {
        p1 = (Aig_Obj_t *)((ulong)((uint)pObj->pFanin1 & 1) ^ *(ulong *)(uVar1 + 0x28));
      }
      pAVar2 = Aig_And(pNew,pAVar2,p1);
      (pObj->field_5).pData = pAVar2;
    }
    return;
  }
  pObj->TravId = p->nTravIds;
  pAVar2 = Aig_ObjCreateCi(pNew);
  (pObj->field_5).pData = pAVar2;
  if ((*(ulong *)&pObj->field_0x18 & 0x10) == 0) {
    if ((*(ulong *)&pObj->field_0x18 & 0x20) == 0) goto LAB_0052a504;
    uStack_30 = 0x20;
  }
  else {
    uStack_30 = 0x10;
  }
  *(ulong *)&pAVar2->field_0x18 = *(ulong *)&pAVar2->field_0x18 | uStack_30;
LAB_0052a504:
  Vec_IntPush(vPio2Id,pObj->Id);
  return;
}

Assistant:

void Aig_ManPartSplitOne_rec( Aig_Man_t * pNew, Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Int_t * vPio2Id )
{
    if ( !Aig_ObjIsTravIdCurrent( p, pObj ) )
    { // new PI
        Aig_ObjSetTravIdCurrent( p, pObj );
/*
        if ( pObj->fMarkA ) // const0
            pObj->pData = Aig_ManConst0( pNew );
        else if ( pObj->fMarkB ) // const1
            pObj->pData = Aig_ManConst1( pNew );
        else
*/
        {
            pObj->pData = Aig_ObjCreateCi( pNew );
            if ( pObj->fMarkA ) // const0
                ((Aig_Obj_t *)pObj->pData)->fMarkA = 1;
            else if ( pObj->fMarkB ) // const1
                ((Aig_Obj_t *)pObj->pData)->fMarkB = 1;
            Vec_IntPush( vPio2Id, Aig_ObjId(pObj) );
        }
        return;
    }
    if ( pObj->pData ) 
        return;
    Aig_ManPartSplitOne_rec( pNew, p, Aig_ObjFanin0(pObj), vPio2Id );
    Aig_ManPartSplitOne_rec( pNew, p, Aig_ObjFanin1(pObj), vPio2Id );
    pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
}